

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O3

void Abc_TgSimpleEnumeration(Abc_TgMan_t *pMan)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  int pGid [16];
  int local_7c [19];
  
  iVar10 = pMan->nGroups;
  if ((long)iVar10 < 1) {
    iVar5 = 0;
  }
  else {
    lVar7 = 0;
    iVar5 = 0;
    do {
      cVar1 = pMan->pGroup[lVar7].nGVars;
      if ('\0' < cVar1) {
        lVar9 = 0;
        do {
          local_7c[(long)iVar5 + lVar9 + 1] = (int)lVar7;
          lVar9 = lVar9 + 1;
        } while ((int)cVar1 != (int)lVar9);
        iVar5 = iVar5 + (int)lVar9;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar10);
  }
  if (iVar5 != pMan->nGVars) {
    __assert_fail("k == pMan->nGVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                  ,0x866,"void Abc_TgSimpleEnumeration(Abc_TgMan_t *)");
  }
  local_7c[0] = local_7c[2];
  iVar10 = 0;
  do {
    uVar11 = 0;
    if (1 < pMan->nGVars) {
      uVar11 = 0;
      lVar7 = (ulong)(pMan->nGVars - 2) + 1;
      do {
        if (local_7c[lVar7] == local_7c[lVar7 + 1]) {
          uVar4 = 1;
          if (local_7c[lVar7] < 1) {
            uVar4 = (uint)(pMan->fPhased != 0);
          }
          uVar4 = Abc_TgSymGroupPerm(pMan,(int)lVar7 + -1,uVar4);
          uVar11 = uVar11 | uVar4;
        }
        lVar9 = lVar7 + -1;
        bVar3 = 0 < lVar7;
        lVar7 = lVar9;
      } while (lVar9 != 0 && bVar3);
      iVar5 = pMan->nGVars;
      if (2 < iVar5) {
        lVar7 = 1;
        iVar6 = local_7c[0];
        do {
          iVar2 = local_7c[lVar7 + 2];
          if (iVar6 == iVar2) {
            uVar4 = 1;
            if (iVar6 < 1) {
              uVar4 = (uint)(pMan->fPhased != 0);
            }
            uVar4 = Abc_TgSymGroupPerm(pMan,(int)lVar7,uVar4);
            uVar11 = uVar11 | uVar4;
            iVar5 = pMan->nGVars;
          }
          lVar7 = lVar7 + 1;
          iVar6 = iVar2;
        } while (lVar7 < iVar5 + -1);
      }
    }
    uVar12 = (long)pMan->nVars;
    if (0 < (long)pMan->nVars) {
      do {
        if ((&pMan->pGroup[0xf].nGVars)[uVar12] != '\0') {
          uVar4 = Abc_TgPermPhase(pMan,(int)uVar12 + -1);
          uVar11 = uVar11 | uVar4;
        }
        bVar3 = 1 < uVar12;
        uVar12 = uVar12 - 1;
      } while (bVar3);
      iVar5 = pMan->nVars;
      if (1 < iVar5) {
        lVar7 = 1;
        pcVar8 = pMan->symPhase;
        do {
          pcVar8 = pcVar8 + 1;
          if (*pcVar8 != '\0') {
            uVar4 = Abc_TgPermPhase(pMan,(int)lVar7);
            uVar11 = uVar11 | uVar4;
            iVar5 = pMan->nVars;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < iVar5);
      }
    }
  } while ((uVar11 != 0) && (iVar10 = iVar10 + 1, iVar10 != 5));
  iVar10 = Abc_TgCannonVerify(pMan);
  if (iVar10 == 0) {
    __assert_fail("Abc_TgCannonVerify(pMan)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                  ,0x87a,"void Abc_TgSimpleEnumeration(Abc_TgMan_t *)");
  }
  return;
}

Assistant:

static void Abc_TgSimpleEnumeration(Abc_TgMan_t * pMan)
{
    int i, j, k;
    int pGid[16];

    for (k = j = 0; j < pMan->nGroups; j++)
        for (i = 0; i < pMan->pGroup[j].nGVars; i++, k++)
            pGid[k] = j;
    assert(k == pMan->nGVars);

    for (k = 0; k < 5; k++)
    {
        int fChanges = 0;
        for (i = pMan->nGVars - 2; i >= 0; i--)
            if (pGid[i] == pGid[i + 1])
                fChanges |= Abc_TgSymGroupPerm(pMan, i, pGid[i] > 0 || pMan->fPhased);
        for (i = 1; i < pMan->nGVars - 1; i++)
            if (pGid[i] == pGid[i + 1])
                fChanges |= Abc_TgSymGroupPerm(pMan, i, pGid[i] > 0 || pMan->fPhased);

        for (i = pMan->nVars - 1; i >= 0; i--)
            if (pMan->symPhase[i])
                fChanges |= Abc_TgPermPhase(pMan, i);
        for (i = 1; i < pMan->nVars; i++)
            if (pMan->symPhase[i])
                fChanges |= Abc_TgPermPhase(pMan, i);
        if (!fChanges) break;
    }
    assert(Abc_TgCannonVerify(pMan));
}